

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

dump_error_category * __thiscall
(anonymous_namespace)::dump_error_category::message_abi_cxx11_(dump_error_category *this,int error)

{
  char *pcVar1;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  allocator local_29;
  char *local_28;
  char *result;
  undefined8 uStack_18;
  int error_local;
  dump_error_category *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,error);
  local_28 = "unknown error";
  switch(in_EDX) {
  case 1:
    local_28 = "bad digest";
    break;
  case 2:
    local_28 = "no fragment index";
    break;
  case 3:
    local_28 = "fragment not found";
    break;
  case 4:
    local_28 = "no compilation index";
    break;
  case 5:
    local_28 = "compilation not found";
    break;
  case 6:
    local_28 = "debug line header not found";
    break;
  case 7:
    local_28 = "no debug line header index";
  }
  pcVar1 = local_28;
  this_local = (dump_error_category *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return this;
}

Assistant:

std::string dump_error_category::message (int error) const {
        auto * result = "unknown error";
        switch (static_cast<dump_error_code> (error)) {
        case dump_error_code::bad_digest: result = "bad digest"; break;
        case dump_error_code::no_fragment_index: result = "no fragment index"; break;
        case dump_error_code::fragment_not_found: result = "fragment not found"; break;
        case dump_error_code::no_compilation_index: result = "no compilation index"; break;
        case dump_error_code::compilation_not_found: result = "compilation not found"; break;
        case dump_error_code::debug_line_header_not_found:
            result = "debug line header not found";
            break;
        case dump_error_code::no_debug_line_header_index:
            result = "no debug line header index";
            break;
        }
        return result;
    }